

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O2

bool __thiscall
duckdb::BitpackingState<signed_char,signed_char>::
Update<duckdb::BitpackingCompressionState<signed_char,true,signed_char>::BitpackingWriter>
          (BitpackingState<signed_char,signed_char> *this,char value,bool is_valid)

{
  BitpackingState<signed_char,signed_char> BVar1;
  bool bVar2;
  long lVar3;
  
  lVar3 = *(long *)(this + 0x1810);
  this[lVar3 + 0x1010] = (BitpackingState<signed_char,signed_char>)is_valid;
  this[0x182f] = (BitpackingState<signed_char,signed_char>)((byte)this[0x182f] & is_valid);
  this[0x1830] = (BitpackingState<signed_char,signed_char>)((byte)this[0x1830] & !is_valid);
  if (is_valid) {
    *(char *)(*(long *)(this + 0x808) + lVar3) = value;
    BVar1 = SUB41(*(undefined4 *)(this + 0x1828),0);
    if (value <= (char)SUB41(*(undefined4 *)(this + 0x1828),0)) {
      BVar1 = (BitpackingState<signed_char,signed_char>)value;
    }
    this[0x1828] = BVar1;
    if (value < (char)this[0x1829]) {
      value = (char)this[0x1829];
    }
    this[0x1829] = (BitpackingState<signed_char,signed_char>)value;
    lVar3 = *(long *)(this + 0x1810);
  }
  *(long *)(this + 0x1810) = lVar3 + 1;
  if (lVar3 + 1 == 0x800) {
    bVar2 = Flush<duckdb::BitpackingCompressionState<signed_char,true,signed_char>::BitpackingWriter>
                      (this);
    BitpackingState<signed_char,_signed_char>::Reset
              ((BitpackingState<signed_char,_signed_char> *)this);
  }
  else {
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool Update(T value, bool is_valid) {
		compression_buffer_validity[compression_buffer_idx] = is_valid;
		all_valid = all_valid && is_valid;
		all_invalid = all_invalid && !is_valid;

		if (is_valid) {
			compression_buffer[compression_buffer_idx] = value;
			minimum = MinValue<T>(minimum, value);
			maximum = MaxValue<T>(maximum, value);
		}

		compression_buffer_idx++;

		if (compression_buffer_idx == BITPACKING_METADATA_GROUP_SIZE) {
			bool success = Flush<OP>();
			Reset();
			return success;
		}
		return true;
	}